

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O3

void obuf_create(obuf *buf,slab_cache *slabc,size_t start_capacity)

{
  buf->slabc = slabc;
  buf->pos = 0;
  buf->n_iov = 0;
  buf->used = 0;
  buf->start_capacity = start_capacity;
  buf->capacity[0] = 0;
  buf->reserved = false;
  buf->iov[0].iov_base = (void *)0x0;
  buf->iov[0].iov_len = 0;
  return;
}

Assistant:

void
obuf_create(struct obuf *buf, struct slab_cache *slabc, size_t start_capacity)
{
	buf->slabc = slabc;
	buf->n_iov = 0;
	buf->pos = 0;
	buf->used = 0;
	buf->start_capacity= start_capacity;
	buf->iov[0].iov_base = NULL;
	buf->iov[0].iov_len = 0;
	buf->capacity[0] = 0;
#ifndef NDEBUG
	buf->reserved = false;
#endif
}